

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O1

ssize_t __thiscall
chatter::Protocol::send(Protocol *this,int __fd,void *__buf,size_t __n,int __flags)

{
  size_t *psVar1;
  SeqNum SVar2;
  Packet *this_00;
  Peer *this_01;
  Host *this_02;
  bool bVar3;
  byte bVar4;
  ushort uVar5;
  ssize_t in_RAX;
  _Node *p_Var6;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ushort uVar7;
  undefined4 in_register_00000034;
  shared_ptr<chatter::Packet> *__args;
  ptr local_38;
  
  __args = (shared_ptr<chatter::Packet> *)CONCAT44(in_register_00000034,__fd);
  this_00 = (__args->super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (this_00 != (Packet *)0x0) {
    this_01 = this_00->m_peer;
    bVar3 = Packet::has_flag(this_00,RELIABLE);
    if (bVar3) {
      bVar4 = Packet::get_channel((__args->
                                  super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr);
      SVar2 = this_01->m_channels[bVar4].next_sequence;
      this_01->m_channels[bVar4].next_sequence = SVar2 + 1;
      ((__args->super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      m_sequence_num = SVar2;
      p_Var6 = std::__cxx11::
               list<std::shared_ptr<chatter::Packet>,std::allocator<std::shared_ptr<chatter::Packet>>>
               ::_M_create_node<std::shared_ptr<chatter::Packet>const&>
                         ((list<std::shared_ptr<chatter::Packet>,std::allocator<std::shared_ptr<chatter::Packet>>>
                           *)&this_01->m_channels[bVar4].sent_reliable,__args);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      psVar1 = &this_01->m_channels[bVar4].sent_reliable.
                super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    uVar5 = Peer::get_rto(this_01);
    if (2999 < uVar5) {
      uVar5 = 3000;
    }
    uVar7 = 10;
    if (10 < uVar5) {
      uVar7 = uVar5;
    }
    local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (__args->super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_rto = uVar7
    ;
    (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_send_queued
         = true;
    this_02 = this->m_host;
    local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (__args->super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    Host::queue_outgoing_packet(this_02,&local_38,SUB81(__buf,0));
    in_RAX = extraout_RAX;
    if (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<chatter::Packet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      in_RAX = extraout_RAX_00;
    }
  }
  return in_RAX;
}

Assistant:

void Protocol::send(Packet::ptr packet, bool immediate /* = false */)
{
    if (!packet)
        return;

    Peer* peer = packet->m_peer;

    if (packet->has_flag(PacketFlag::RELIABLE)) {
        /* Assign a sequence number for this packet and track it.*/
        ProtocolChannel& chan = peer->m_channels[packet->get_channel()];
        packet->m_sequence_num = chan.next_sequence++;
        chan.sent_reliable.push_back(packet);
    }

    packet->m_rto = limit_rto(peer->get_rto());
    packet->m_send_queued = true;

    m_host->queue_outgoing_packet(packet, immediate);
}